

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O3

void __thiscall stateObservation::tools::Logger::clearLogs(Logger *this)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->logs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->logs_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    p_Var1[1]._M_parent =
         (_Base_ptr)
         ((long)p_Var1[1]._M_parent +
         ((long)p_Var1[2]._M_left - *(long *)(p_Var1 + 2) >> 3) * -0x5555555555555555 +
         (((long)p_Var1[3]._M_right - (long)p_Var1[2]._M_right >> 3) + -1 +
         (ulong)(p_Var1[3]._M_right == (_Base_ptr)0x0)) * 0x15 +
         (*(long *)(p_Var1 + 3) - (long)p_Var1[3]._M_parent >> 3) * -0x5555555555555555);
    std::
    deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::clear((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             *)&p_Var1[1]._M_left);
  }
  return;
}

Assistant:

void Logger::clearLogs()
{
  for(std::map<const void *, log_s>::iterator i = logs_.begin(); i != logs_.end(); ++i)
  {
    i->second.array.clear();
  }
}